

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuidedMeshNormalFiltering.cpp
# Opt level: O3

void __thiscall
GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme
          (GuidedMeshNormalFiltering *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppvVar1;
  ParameterSet *pPVar2;
  pointer pVVar3;
  mesh_ptr pPVar4;
  bool bVar5;
  int iVar6;
  pointer *centroid;
  long lVar7;
  long lVar8;
  GuidedMeshNormalFiltering *pGVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  FaceIter FVar19;
  GuidedMeshNormalFiltering local_198;
  undefined1 local_180 [8];
  vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
  range_and_mean_normal;
  double multiple_radius;
  double multiple_sigma_s;
  double sigma_r;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_guided_neighbor;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  guided_normals;
  undefined1 local_f0 [8];
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  FaceIter f_it;
  int face_neighbor_index;
  int vertex_iteration_number;
  int local_5c;
  undefined1 auStack_58 [4];
  int normal_iteration_number;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  bool local_31 [8];
  bool include_central_face;
  
  iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(mesh);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,(long)iVar6);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  ppvVar1 = &all_face_neighbor.
             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  _auStack_58 = (pointer)ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"Face Neighbor","");
  bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,(int *)&f_it.hnd_);
  if ((pointer *)_auStack_58 != ppvVar1) {
    operator_delete(_auStack_58);
  }
  if (bVar5) {
    pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
    _auStack_58 = (pointer)ppvVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"include central face","");
    bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,local_31);
    if ((pointer *)_auStack_58 != ppvVar1) {
      operator_delete(_auStack_58);
    }
    if (bVar5) {
      pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
      _auStack_58 = (pointer)ppvVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)auStack_58,"Multiple(* avg face dis.)","");
      bVar5 = ParameterSet::getValue
                        (pPVar2,(string *)auStack_58,
                         (double *)
                         &range_and_mean_normal.
                          super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((pointer *)_auStack_58 != ppvVar1) {
        operator_delete(_auStack_58);
      }
      if (bVar5) {
        pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
        _auStack_58 = (pointer)ppvVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)auStack_58,"Multiple(* sigma_s)","");
        bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,&multiple_radius);
        if ((pointer *)_auStack_58 != ppvVar1) {
          operator_delete(_auStack_58);
        }
        if (bVar5) {
          pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
          _auStack_58 = (pointer)ppvVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)auStack_58,"(Local)Normal Iteration Num.","");
          bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,&local_5c);
          if ((pointer *)_auStack_58 != ppvVar1) {
            operator_delete(_auStack_58);
          }
          if (bVar5) {
            pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
            _auStack_58 = (pointer)ppvVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)auStack_58,"sigma_r","");
            bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,&multiple_sigma_s);
            if ((pointer *)_auStack_58 != ppvVar1) {
              operator_delete(_auStack_58);
            }
            if (bVar5) {
              pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
              _auStack_58 = (pointer)ppvVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)auStack_58,"Vertex Iteration Num.","");
              bVar5 = ParameterSet::getValue(pPVar2,(string *)auStack_58,(int *)&f_it.skip_bits_);
              if ((pointer *)_auStack_58 != ppvVar1) {
                operator_delete(_auStack_58);
              }
              if (bVar5) {
                if (f_it.hnd_.super_BaseHandle.idx_ == 0) {
                  _face_neighbor_index =
                       getRadius(this,(double)range_and_mean_normal.
                                              super__Vector_base<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 mesh);
                }
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)auStack_58,(long)iVar6,(allocator_type *)&sigma_r);
                getAllFaceNeighborGMNF
                          (this,mesh,(uint)(f_it.hnd_.super_BaseHandle.idx_ == 0) * 2,
                           _face_neighbor_index,local_31[0],
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)auStack_58);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          *)&sigma_r,(long)iVar6,(allocator_type *)local_f0);
                getAllGuidedNeighborGMNF
                          (this,mesh,
                           (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                            *)&sigma_r);
                MeshDenoisingBase::getFaceNormal
                          (&this->super_MeshDenoisingBase,mesh,filtered_normals);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::vector<double,_std::allocator<double>_>::vector
                          ((vector<double,_std::allocator<double>_> *)local_f0,(long)iVar6,
                           (allocator_type *)
                           &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)iVar6,
                         (allocator_type *)
                         &face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&face_centroid.
                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar6,
                         (allocator_type *)
                         &all_guided_neighbor.
                          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&all_guided_neighbor.
                             super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar6,
                         (allocator_type *)local_180);
                iVar6 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                               super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                               .
                                               super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                                    + 0x28))(mesh);
                std::
                vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                          *)local_180,(long)iVar6,
                         (allocator_type *)
                         &previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                if (0 < local_5c) {
                  iVar6 = 0;
                  do {
                    centroid = &face_area.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                    pGVar9 = this;
                    MeshDenoisingBase::getFaceCentroid
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)centroid);
                    dVar11 = getSigmaS(pGVar9,multiple_radius,
                                       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        *)centroid,mesh);
                    MeshDenoisingBase::getFaceArea
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<double,_std::allocator<double>_> *)local_f0);
                    MeshDenoisingBase::getFaceNormal
                              (&this->super_MeshDenoisingBase,mesh,
                               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                *)&face_centroid.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    pGVar9 = &local_198;
                    std::
                    vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                    ::vector((vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)pGVar9,
                             (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                              *)local_180);
                    getGuidedNormals(pGVar9,mesh,
                                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                      *)&sigma_r,(vector<double,_std::allocator<double>_> *)local_f0
                                     ,(vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)&face_centroid.
                                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (vector<std::pair<double,_OpenMesh::VectorT<double,_3>_>,_std::allocator<std::pair<double,_OpenMesh::VectorT<double,_3>_>_>_>
                                      *)&local_198,
                                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                      *)&all_guided_neighbor.
                                         super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                    if (local_198.super_MeshDenoisingBase._vptr_MeshDenoisingBase !=
                        (_func_int **)0x0) {
                      operator_delete(local_198.super_MeshDenoisingBase._vptr_MeshDenoisingBase);
                    }
                    join_0x00000010_0x00000000_ =
                         OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
                    while( true ) {
                      FVar19 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
                      if (f_it.mesh_._0_4_ == (BaseHandle)FVar19.hnd_.super_BaseHandle.idx_ &&
                          (mesh_ptr)
                          face_neighbor.
                          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage == FVar19.mesh_) break;
                      lVar7 = (long)(int)f_it.mesh_._0_4_;
                      std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                      vector((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             &previous_normals.
                              super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             (_auStack_58 + lVar7 * 0x18));
                      if ((int)((ulong)((long)face_neighbor.
                                              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                              ._M_impl.super__Vector_impl_data._M_start -
                                       (long)previous_normals.
                                             super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage) >>
                               2) < 1) {
                        dVar17 = 0.0;
                        dVar18 = 0.0;
                        dVar16 = 0.0;
                      }
                      else {
                        dVar16 = 0.0;
                        lVar8 = 0;
                        dVar18 = 0.0;
                        dVar17 = 0.0;
                        do {
                          lVar10 = (long)*(int *)((long)((previous_normals.
                                                                                                                    
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->super_VectorDataT<double,_3>).values_ +
                                                 lVar8 * 4);
                          dVar13 = SQRT((face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3 + 2] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3 + 2]) *
                                        (face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3 + 2] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3 + 2]) +
                                        (face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3]) *
                                        (face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3]) +
                                        (face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3 + 1] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3 + 1]) *
                                        (face_area.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_end_of_storage[lVar7 * 3 + 1] -
                                        face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage[lVar10 * 3 + 1]));
                          dVar13 = exp((dVar13 * -0.5 * dVar13) / (dVar11 * dVar11));
                          dVar14 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar7]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           [lVar10].
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_start;
                          dVar15 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar7]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           [lVar10].
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_finish;
                          dVar12 = (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar7]
                                           .
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (double)all_guided_neighbor.
                                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage
                                           [lVar10].
                                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                          dVar12 = SQRT(dVar12 * dVar12 + dVar14 * dVar14 + dVar15 * dVar15);
                          dVar12 = exp((dVar12 * -0.5 * dVar12) /
                                       (multiple_sigma_s * multiple_sigma_s));
                          dVar12 = dVar13 * *(double *)((long)local_f0 + lVar10 * 8) * dVar12;
                          dVar17 = dVar17 + face_centroid.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            [lVar10].super_VectorDataT<double,_3>.values_[0] *
                                            dVar12;
                          dVar18 = dVar18 + face_centroid.
                                            super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            [lVar10].super_VectorDataT<double,_3>.values_[1] *
                                            dVar12;
                          dVar16 = dVar16 + dVar12 * face_centroid.
                                                                                                          
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [lVar10].super_VectorDataT<double,_3>.values_[2];
                          lVar8 = lVar8 + 1;
                        } while (lVar8 < (int)((ulong)((long)face_neighbor.
                                                                                                                          
                                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                                  (long)previous_normals.
                                                                                                                
                                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ) >> 2));
                      }
                      if ((pointer)face_neighbor.
                                   super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   ._M_impl.super__Vector_impl_data._M_start !=
                          previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        dVar13 = SQRT(dVar16 * dVar16 + dVar17 * dVar17 + dVar18 * dVar18);
                        pVVar3 = (filtered_normals->
                                 super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        pVVar3[lVar7].super_VectorDataT<double,_3>.values_[0] = dVar17 / dVar13;
                        pVVar3[lVar7].super_VectorDataT<double,_3>.values_[1] = dVar18 / dVar13;
                        pVVar3[lVar7].super_VectorDataT<double,_3>.values_[2] = dVar16 / dVar13;
                      }
                      if (previous_normals.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                        operator_delete(previous_normals.
                                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                      pPVar4 = f_it.mesh_;
                      f_it.mesh_._0_4_ =
                           (BaseHandle)(BaseHandle)((int)face_neighbor._24_4_.super_BaseHandle + 1);
                      if ((ulong)pPVar4 >> 0x20 != 0) {
                        OpenMesh::Iterators::
                        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)&face_neighbor.
                                       super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
                      }
                    }
                    MeshDenoisingBase::updateVertexPosition
                              (&this->super_MeshDenoisingBase,mesh,filtered_normals,f_it.skip_bits_,
                               false);
                    iVar6 = iVar6 + 1;
                  } while (iVar6 < local_5c);
                }
                if (local_180 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_180);
                }
                if (all_guided_neighbor.
                    super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(all_guided_neighbor.
                                  super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(face_centroid.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  operator_delete(face_area.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                if (local_f0 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_f0);
                }
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)&sigma_r);
                std::
                vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           *)auStack_58);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void GuidedMeshNormalFiltering::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize((int)mesh.n_faces());
    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    bool include_central_face;
    if(!parameter_set_->getValue(string("include central face"), include_central_face))
        return;
    double multiple_radius;
    if(!parameter_set_->getValue(string("Multiple(* avg face dis.)"), multiple_radius))
        return;
    double multiple_sigma_s;
    if(!parameter_set_->getValue(string("Multiple(* sigma_s)"), multiple_sigma_s))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("(Local)Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_r;
    if(!parameter_set_->getValue(string("sigma_r"), sigma_r))
        return;
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = face_neighbor_index == 0 ? kRadiusBased : kVertexBased;

    double radius;
    if(face_neighbor_type == kRadiusBased)
        radius = getRadius(multiple_radius, mesh);

    std::vector<std::vector<TriMesh::FaceHandle> > all_face_neighbor((int)mesh.n_faces());
    getAllFaceNeighborGMNF(mesh, face_neighbor_type, radius, include_central_face, all_face_neighbor);
    std::vector<std::vector<TriMesh::FaceHandle> > all_guided_neighbor((int)mesh.n_faces());
    getAllGuidedNeighborGMNF(mesh, all_guided_neighbor);
    getFaceNormal(mesh, filtered_normals);

    std::vector<double> face_area((int)mesh.n_faces());
    std::vector<TriMesh::Point> face_centroid((int)mesh.n_faces());
    std::vector<TriMesh::Normal> previous_normals((int)mesh.n_faces());
    std::vector<TriMesh::Normal> guided_normals((int)mesh.n_faces());
    std::vector<std::pair<double, TriMesh::Normal> > range_and_mean_normal((int)mesh.n_faces());
    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        getFaceCentroid(mesh, face_centroid);
        double sigma_s = getSigmaS(multiple_sigma_s, face_centroid, mesh);
        getFaceArea(mesh, face_area);
        getFaceNormal(mesh, previous_normals);

        getGuidedNormals(mesh, all_guided_neighbor, face_area, previous_normals, range_and_mean_normal, guided_normals);

        // Filtered Face Normals
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index = f_it->idx();
            const std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index];
            TriMesh::Normal filtered_normal(0.0, 0.0, 0.0);
            for(int j = 0; j < (int)face_neighbor.size(); j++)
            {
                int current_face_index = face_neighbor[j].idx();

                double spatial_dis = (face_centroid[index] - face_centroid[current_face_index]).length();
                double spatial_weight = GaussianWeight(spatial_dis, sigma_s);
                double range_dis = (guided_normals[index] - guided_normals[current_face_index]).length();
                double range_weight = GaussianWeight(range_dis, sigma_r);

                filtered_normal += previous_normals[current_face_index] * (face_area[current_face_index] * spatial_weight * range_weight);
            }
            if(face_neighbor.size())
                filtered_normals[index] = filtered_normal.normalize();
        }

        // immediate update vertex position
        updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, false);
    }
}